

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O0

bool __thiscall CmdCp::CopyFile(CmdCp *this,string *fileFrom,string *fileTo)

{
  bool bVar1;
  byte bVar2;
  FileType FVar3;
  char *pcVar4;
  ostream *poVar5;
  long *plVar6;
  undefined1 local_481;
  char local_480 [7];
  char buf;
  ofstream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  undefined4 local_240;
  char local_230 [8];
  ifstream fin;
  string *fileTo_local;
  string *fileFrom_local;
  CmdCp *this_local;
  
  bVar1 = DirUtils::IsSameDir(fileFrom,fileTo);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"cp: \'");
    poVar5 = std::operator<<(poVar5,(string *)fileFrom);
    poVar5 = std::operator<<(poVar5,"\' and \'");
    poVar5 = std::operator<<(poVar5,(string *)fileTo);
    poVar5 = std::operator<<(poVar5,"\' are the same file");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_230,pcVar4,_S_bin);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"cp: cannot stat \'");
      poVar5 = std::operator<<(poVar5,(string *)fileFrom);
      poVar5 = std::operator<<(poVar5,"\': No such file or directory");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
      local_240 = 1;
    }
    else {
      FVar3 = DirUtils::GetFileType(fileTo);
      if (FVar3 == DU_DIRECTORY) {
        std::operator+(local_280,(char *)fileTo);
        std::operator+(local_260,local_280);
        std::__cxx11::string::operator=((string *)fileTo,(string *)local_260);
        std::__cxx11::string::~string((string *)local_260);
        std::__cxx11::string::~string((string *)local_280);
      }
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_480,pcVar4,_S_bin);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"cp: cannot regular file \'");
        poVar5 = std::operator<<(poVar5,(string *)fileTo);
        poVar5 = std::operator<<(poVar5,"\': No such file or directory");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        while( true ) {
          plVar6 = (long *)std::istream::read(local_230,(long)&local_481);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
          if (!bVar1) break;
          std::ostream::write(local_480,(long)&local_481);
        }
        std::ifstream::close();
        std::ofstream::close();
        this_local._7_1_ = true;
      }
      local_240 = 1;
      std::ofstream::~ofstream(local_480);
    }
    std::ifstream::~ifstream(local_230);
  }
  return this_local._7_1_;
}

Assistant:

bool CmdCp::CopyFile(string fileFrom, string fileTo){
	if(IsSameDir(fileFrom, fileTo)){
		cout << "cp: '" << fileFrom << "' and '" << fileTo << "' are the same file" << endl;
		return false;
	}
	/* input file */
	ifstream fin(fileFrom.c_str(), ios::binary);
	if(!fin.is_open()){
		cout << "cp: cannot stat '" << fileFrom << "': No such file or directory" << endl;
		return false;
	}
	/* output file */
	if(GetFileType(fileTo) == DU_DIRECTORY){
		fileTo = fileTo + "/" + fileFrom;
	}
	
	ofstream fout(fileTo.c_str(), ios::binary);
	if(!fout.is_open()){
		cout << "cp: cannot regular file '" << fileTo << "': No such file or directory" << endl;
		return false;
	}
	/* copying */
	char buf;
	while(fin.read(&buf, sizeof(buf))){
		fout.write(&buf, sizeof(buf));
	}
	fin.close();
	fout.close();
	return true;
}